

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QDnsTlsAssociationRecord>::moveAppend
          (QGenericArrayOps<QDnsTlsAssociationRecord> *this,QDnsTlsAssociationRecord *b,
          QDnsTlsAssociationRecord *e)

{
  qsizetype *pqVar1;
  QDnsTlsAssociationRecord *pQVar2;
  long lVar3;
  QDnsTlsAssociationRecordPrivate *pQVar4;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QDnsTlsAssociationRecord>).ptr;
    for (; b < e; b = b + 1) {
      lVar3 = (this->super_QArrayDataPointer<QDnsTlsAssociationRecord>).size;
      pQVar4 = (b->d).d.ptr;
      (b->d).d.ptr = (QDnsTlsAssociationRecordPrivate *)0x0;
      pQVar2[lVar3].d.d.ptr = pQVar4;
      pqVar1 = &(this->super_QArrayDataPointer<QDnsTlsAssociationRecord>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }